

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

int __thiscall Js::JavascriptBigInt::Compare(JavascriptBigInt *this,JavascriptBigInt *pbi)

{
  Type TVar1;
  uint uVar2;
  uint uVar3;
  
  TVar1 = this->m_isNegative;
  if (TVar1 == pbi->m_isNegative) {
    uVar2 = CompareAbsolute(this,pbi);
    uVar3 = -uVar2;
    if (TVar1 == false) {
      uVar3 = uVar2;
    }
  }
  else {
    uVar3 = -(uint)TVar1 | 1;
  }
  return uVar3;
}

Assistant:

int JavascriptBigInt::Compare(JavascriptBigInt *pbi)
    {
        if (m_isNegative != pbi->m_isNegative)
        {
            if (m_isNegative)
            {
                return -1;
            }
            else
            {
                return 1;
            }
        }

        int sign = m_isNegative ? -1 : 1;
        return sign * JavascriptBigInt::CompareAbsolute(pbi);
    }